

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O0

void GPU_MatrixScale(float *result,float sx,float sy,float sz)

{
  float local_68 [2];
  float A [16];
  float sz_local;
  float sy_local;
  float sx_local;
  float *result_local;
  
  if (result != (float *)0x0) {
    local_68[1] = 0.0;
    A[0] = 0.0;
    A[1] = 0.0;
    A[2] = 0.0;
    A[4] = 0.0;
    A[5] = 0.0;
    A[6] = 0.0;
    A[7] = 0.0;
    A[9] = 0.0;
    A[10] = 0.0;
    A[0xb] = 0.0;
    A[0xc] = 0.0;
    A[0xd] = 1.0;
    local_68[0] = sx;
    A[3] = sy;
    A[8] = sz;
    GPU_MultiplyAndAssign(result,local_68);
  }
  return;
}

Assistant:

void GPU_MatrixScale(float* result, float sx, float sy, float sz)
{
    if(result == NULL)
		return;

	{
		float A[16];
		FILL_MATRIX_4x4(A,
				sx, 0, 0, 0,
				0, sy, 0, 0,
				0, 0, sz, 0,
				0, 0, 0, 1
			);

		GPU_MultiplyAndAssign(result, A);
	}
}